

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_OneFlagShort_Test::TestBody(TApp_OneFlagShort_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  AssertHelper local_160;
  Message local_158;
  allocator local_149;
  string local_148;
  size_t local_128;
  unsigned_long local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  Message local_100;
  allocator local_f1;
  string local_f0;
  size_t local_d0;
  unsigned_long local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  iterator local_80;
  size_type local_78;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  TApp_OneFlagShort_Test *local_10;
  TApp_OneFlagShort_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"-c,--count",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  CLI::App::add_flag(&(this->super_TApp).app,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  gtest_ar.message_.ptr_._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"-c",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  gtest_ar.message_.ptr_._6_1_ = 0;
  local_80 = &local_a0;
  local_78 = 1;
  __l._M_len = 1;
  __l._M_array = local_80;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80;
  do {
    local_198 = local_198 + -1;
    std::__cxx11::string::~string((string *)local_198);
  } while (local_198 != &local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_c8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"-c",&local_f1);
  local_d0 = CLI::App::count(&(this->super_TApp).app,&local_f0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_c0,"(size_t)1","app.count(\"-c\")",&local_c8,&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_120 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"--count",&local_149);
  local_128 = CLI::App::count(&(this->super_TApp).app,&local_148);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_118,"(size_t)1","app.count(\"--count\")",&local_120,&local_128
            );
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  return;
}

Assistant:

TEST_F(TApp, OneFlagShort) {
    app.add_flag("-c,--count");
    args = {"-c"};
    run();
    EXPECT_EQ((size_t)1, app.count("-c"));
    EXPECT_EQ((size_t)1, app.count("--count"));
}